

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
          (ColorBlendState *this,ColorBlendState *createInfo,
          vector<float,_std::allocator<float>_> *_blendConstants)

{
  uint uVar1;
  VkPipelineColorBlendAttachmentState *__first;
  size_type sVar2;
  reference pvVar3;
  reference src;
  allocator<vk::VkPipelineColorBlendAttachmentState> local_21;
  vector<float,_std::allocator<float>_> *local_20;
  vector<float,_std::allocator<float>_> *_blendConstants_local;
  ColorBlendState *createInfo_local;
  ColorBlendState *this_local;
  
  __first = (createInfo->super_VkPipelineColorBlendStateCreateInfo).pAttachments;
  uVar1 = (createInfo->super_VkPipelineColorBlendStateCreateInfo).attachmentCount;
  local_20 = _blendConstants;
  _blendConstants_local = (vector<float,_std::allocator<float>_> *)createInfo;
  createInfo_local = this;
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::allocator(&local_21);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&this->m_attachments,__first,__first + uVar1,&local_21);
  std::allocator<vk::VkPipelineColorBlendAttachmentState>::~allocator(&local_21);
  (this->super_VkPipelineColorBlendStateCreateInfo).sType =
       *(VkStructureType *)
        &(_blendConstants_local->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_start;
  (this->super_VkPipelineColorBlendStateCreateInfo).pNext =
       (_blendConstants_local->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->super_VkPipelineColorBlendStateCreateInfo).flags =
       *(VkPipelineColorBlendStateCreateFlags *)
        &(_blendConstants_local->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOpEnable =
       *(VkBool32 *)
        ((long)&(_blendConstants_local->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage + 4);
  (this->super_VkPipelineColorBlendStateCreateInfo).logicOp =
       *(VkLogicOp *)
        &_blendConstants_local[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
  sVar2 = std::
          vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
          ::size(&this->m_attachments);
  (this->super_VkPipelineColorBlendStateCreateInfo).attachmentCount = (deUint32)sVar2;
  pvVar3 = std::
           vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ::operator[](&this->m_attachments,0);
  (this->super_VkPipelineColorBlendStateCreateInfo).pAttachments = pvVar3;
  src = std::vector<float,_std::allocator<float>_>::operator[](_blendConstants,0);
  ::deMemcpy((this->super_VkPipelineColorBlendStateCreateInfo).blendConstants,src,0x10);
  return;
}

Assistant:

PipelineCreateInfo::ColorBlendState::ColorBlendState (const ColorBlendState& createInfo, std::vector<float> _blendConstants)
	: m_attachments (createInfo.pAttachments, createInfo.pAttachments + createInfo.attachmentCount)
{
	sType = createInfo.sType;
	pNext = createInfo.pNext;
	flags					= createInfo.flags;
	logicOpEnable			= createInfo.logicOpEnable;
	logicOp					= createInfo.logicOp;
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachments[0];
	deMemcpy(blendConstants, &_blendConstants[0], 4 * sizeof(float));
}